

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool openjtalk_setVoiceU16(OpenJTalk *oj,char16_t *path)

{
  _Bool _Var1;
  size_t sVar2;
  char *pcVar3;
  char temp [260];
  char acStack_118 [264];
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if ((path == (char16_t *)0x0) || (sVar2 = strlenU16(path), sVar2 == 0)) {
      oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
    }
    else {
      pcVar3 = u16tou8_path(path,acStack_118);
      if (pcVar3 != (char *)0x0) {
        _Var1 = set_voice(oj,acStack_118);
        return _Var1;
      }
    }
  }
  return false;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_setVoiceU16(OpenJTalk *oj, const char16_t *path)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return false;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!path || strlenU16(path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
	char temp[MAX_PATH];
#if defined(_WIN32)
	char *res = u16tou8_path(path, temp);
#else
	char *res = u16tou8_path(path, temp);
#endif
	if (!res)
	{
		return false;
	}
	return set_voice(oj, temp);
}